

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsEnableRuntimeExecution(JsRuntimeHandle runtimeHandle)

{
  ThreadContext *this;
  bool bVar1;
  JsErrorCode JVar2;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    this = *runtimeHandle;
    bVar1 = ThreadContext::TestThreadContextFlag(this,ThreadContextFlagCanDisableExecution);
    JVar2 = JsNoError;
    if (bVar1) {
      if (this->recycler != (Recycler *)0x0) {
        bVar1 = Memory::Recycler::IsHeapEnumInProgress(this->recycler);
        JVar2 = JsErrorHeapEnumInProgress;
        if (bVar1) goto LAB_0037f799;
      }
      JVar2 = JsErrorInThreadServiceCallback;
      if ((this->threadService).isInCallback == false) {
        ThreadContextScope::ThreadContextScope
                  ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,this);
        JVar2 = JsErrorWrongThread;
        if (anon_var_0.m_staticAbortMessage._1_1_ == '\x01') {
          JVar2 = JsNoError;
          ThreadContext::EnableExecution(this);
        }
        ThreadContextScope::~ThreadContextScope
                  ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
      }
    }
  }
LAB_0037f799:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar2;
}

Assistant:

CHAKRA_API JsEnableRuntimeExecution(_In_ JsRuntimeHandle runtimeHandle)
{
    return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        if (!threadContext->TestThreadContextFlag(ThreadContextFlagCanDisableExecution))
        {
            return JsNoError;
        }

        if (threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
        {
            return JsErrorHeapEnumInProgress;
        }
        else if (threadContext->IsInThreadServiceCallback())
        {
            return JsErrorInThreadServiceCallback;
        }

        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        threadContext->EnableExecution();
        return JsNoError;
    });
}